

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_htmlmodelserialiser.cpp
# Opt level: O1

int __thiscall HtmlModelSerialiser::qt_metacall(HtmlModelSerialiser *this,Call _c,int _id,void **_a)

{
  int _id_00;
  
  _id_00 = AbstractStringSerialiser::qt_metacall(&this->super_AbstractStringSerialiser,_c,_id,_a);
  if (((-1 < _id_00) && (_c < (BindableProperty|ReadProperty))) &&
     ((0x14eU >> (_c & 0x1f) & 1) != 0)) {
    qt_static_metacall((QObject *)this,_c,_id_00,_a);
    _id_00 = _id_00 + -1;
  }
  return _id_00;
}

Assistant:

int HtmlModelSerialiser::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = AbstractStringSerialiser::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    
#ifndef QT_NO_PROPERTIES
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
#endif // QT_NO_PROPERTIES
    return _id;
}